

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superGate.c
# Opt level: O0

Super_Gate_t_conflict *
Super_CreateGateNew(Super_Man_t *pMan,Mio_Gate_t *pRoot,Super_Gate_t_conflict **pSupers,int nSupers,
                   uint *uTruth,float Area,float *tPinDelaysRes,float tDelayMax,int nPins)

{
  Super_Gate_t_conflict *__s;
  Super_Gate_t_conflict *pSuper;
  float tDelayMax_local;
  float *tPinDelaysRes_local;
  float Area_local;
  uint *uTruth_local;
  int nSupers_local;
  Super_Gate_t_conflict **pSupers_local;
  Mio_Gate_t *pRoot_local;
  Super_Man_t *pMan_local;
  
  __s = (Super_Gate_t_conflict *)Extra_MmFixedEntryFetch(pMan->pMem);
  memset(__s,0,0x70);
  __s->pRoot = pRoot;
  __s->uTruth[0] = *uTruth;
  __s->uTruth[1] = uTruth[1];
  memcpy(__s->ptDelays,tPinDelaysRes,(long)nPins << 2);
  __s->Area = Area;
  *(uint *)&__s->field_0x8 = *(uint *)&__s->field_0x8 & 0xffffff03 | (nSupers & 0x3fU) << 2;
  memcpy(__s->pFanins,pSupers,(long)nSupers << 3);
  __s->pNext = (Super_Gate_t_conflict *)0x0;
  __s->tDelayMax = tDelayMax;
  return __s;
}

Assistant:

Super_Gate_t * Super_CreateGateNew( Super_Man_t * pMan, Mio_Gate_t * pRoot, Super_Gate_t ** pSupers, int nSupers, 
    unsigned uTruth[], float Area, float tPinDelaysRes[], float tDelayMax, int nPins )
{
    Super_Gate_t * pSuper;
    pSuper = (Super_Gate_t *)Extra_MmFixedEntryFetch( pMan->pMem );
    memset( pSuper, 0, sizeof(Super_Gate_t) );
    pSuper->pRoot     = pRoot;
    pSuper->uTruth[0] = uTruth[0];
    pSuper->uTruth[1] = uTruth[1];
    memcpy( pSuper->ptDelays, tPinDelaysRes, sizeof(float) * nPins );
    pSuper->Area      = Area;
    pSuper->nFanins   = nSupers;
    memcpy( pSuper->pFanins, pSupers, sizeof(Super_Gate_t *) * nSupers );
    pSuper->pNext     = NULL;
    pSuper->tDelayMax = tDelayMax;
    return pSuper;
}